

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O1

void __thiscall
jhu::thrax::PhraseTests_RemoveIndices_Test::TestBody(PhraseTests_RemoveIndices_Test *this)

{
  ushort *__src;
  ushort *puVar1;
  bool bVar2;
  ulong uVar3;
  difference_type __d_1;
  short *psVar4;
  ulong uVar5;
  difference_type __d;
  ulong uVar6;
  char *pcVar7;
  ushort *puVar8;
  AssertionResult gtest_ar;
  Indices is;
  Span s;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Indices local_30;
  Span local_14;
  
  local_14.start = 0;
  local_14.end = 3;
  Span::indices(&local_30,&local_14);
  uVar3 = (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start >> 1;
  uVar5 = uVar3;
  puVar1 = (ushort *)
           local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (puVar8 = puVar1,
        puVar1 = (ushort *)
                 local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start, 0 < (long)uVar5) {
    uVar6 = uVar5 >> 1;
    psVar4 = (short *)((uVar5 & 0xfffffffffffffffe) + (long)puVar8);
    uVar5 = ~uVar6 + uVar5;
    puVar1 = (ushort *)(psVar4 + 1);
    if (-1 < *psVar4) {
      uVar5 = uVar6;
      puVar1 = puVar8;
    }
  }
  while (__src = puVar1, 0 < (long)uVar3) {
    uVar5 = uVar3 >> 1;
    psVar4 = (short *)((uVar3 & 0xfffffffffffffffe) + (long)__src);
    uVar3 = ~uVar5 + uVar3;
    puVar1 = (ushort *)(psVar4 + 1);
    if (0 < *psVar4) {
      uVar3 = uVar5;
      puVar1 = __src;
    }
  }
  if (puVar8 != (ushort *)
                local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    puVar8 = puVar8 + (*puVar8 >> 0xf);
  }
  if (puVar8 != __src) {
    if ((long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__src != 0) {
      memmove(puVar8,__src,
              (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src);
    }
    puVar8 = (ushort *)
             ((long)puVar8 +
             ((long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src));
    if ((ushort *)
        local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_finish != puVar8) {
      local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)puVar8;
    }
  }
  local_48.data_._0_4_ = 2;
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_start >> 1);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_40,"2","is.size()",(int *)&local_48,(unsigned_long *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x6a,pcVar7);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.ptr_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,short>
              (local_40,"1","is.front()",(int *)&local_50,
               local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x6b,pcVar7);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_50.ptr_ + 8))();
        }
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.ptr_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,short>
              (local_40,"2","is.back()",(int *)&local_50,
               local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_finish + -1);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x6c,pcVar7);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_50.ptr_ + 8))();
        }
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((ushort *)
      local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (ushort *)0x0) {
    operator_delete(local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(PhraseTests, RemoveIndices) {
  Span s{0, 3};
  auto is = s.indices();
  removeIndices(is, {0, 1});
  ASSERT_EQ(2, is.size());
  EXPECT_EQ(1, is.front());
  EXPECT_EQ(2, is.back());
}